

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11_meta_getattro(PyObject *obj,PyObject *name)

{
  PyObject *pPVar1;
  
  pPVar1 = (PyObject *)_PyType_Lookup();
  if ((pPVar1 != (PyObject *)0x0) && (pPVar1->ob_type == (PyTypeObject *)&PyInstanceMethod_Type)) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    return pPVar1;
  }
  pPVar1 = (PyObject *)(*___throw_logic_error)(obj,name);
  return pPVar1;
}

Assistant:

inline PyObject *pybind11_meta_getattro(PyObject *obj, PyObject *name) {
    PyObject *descr = _PyType_Lookup((PyTypeObject *) obj, name);
    if (descr && PyInstanceMethod_Check(descr)) {
        Py_INCREF(descr);
        return descr;
    }
    else {
        return PyType_Type.tp_getattro(obj, name);
    }
}